

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputeOriginalValues
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CorrType *in_corr,int *out_data,int param_4,int num_components,
          PointIndex *entry_to_point_id_map)

{
  bool bVar1;
  ulong uVar2;
  MeshData *pMVar3;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  size_type sVar4;
  undefined4 in_ECX;
  PredictionSchemeWrapDecodingTransform<int,_int> *in_RDX;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_RDI;
  int in_R8D;
  PointAttribute *in_R9;
  int dst_offset;
  CornerIndex corner_id;
  int p;
  int corner_map_size;
  int in_stack_0000010c;
  int *in_stack_00000110;
  MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_stack_00000118;
  CornerIndex in_stack_00000120;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  PredictionSchemeWrapTransformBase<int> *in_stack_ffffffffffffffa0;
  int local_40;
  int *in_stack_ffffffffffffffc8;
  bool local_1;
  
  if (in_R8D == 2) {
    in_RDI[1].
    super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ = 2;
    in_RDI[1].
    super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    attribute_ = in_R9;
    uVar2 = SUB168(ZEXT816(2) * ZEXT816(4),0);
    if (SUB168(ZEXT816(2) * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    operator_new__(uVar2);
    std::unique_ptr<int[],std::default_delete<int[]>>::
    unique_ptr<int*,std::default_delete<int[]>,void,bool>
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffffa0,
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::unique_ptr<int[],_std::default_delete<int[]>_>::operator=
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffffa0,
               (unique_ptr<int[],_std::default_delete<int[]>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffffa0);
    PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::transform
              (&in_RDI->
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              );
    PredictionSchemeWrapTransformBase<int>::Init
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    pMVar3 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ::mesh_data(in_RDI);
    this_00 = MeshPredictionSchemeData<draco::CornerTable>::data_to_corner_map(pMVar3);
    sVar4 = std::
            vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ::size(this_00);
    for (local_40 = 0; local_40 < (int)sVar4; local_40 = local_40 + 1) {
      pMVar3 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
               ::mesh_data(in_RDI);
      MeshPredictionSchemeData<draco::CornerTable>::data_to_corner_map(pMVar3);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::at((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)in_stack_ffffffffffffffa0,
           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      bVar1 = ComputePredictedValue
                        (in_stack_00000118,in_stack_00000120,in_stack_00000110,in_stack_0000010c);
      if (!bVar1) {
        return false;
      }
      in_stack_ffffffffffffffa0 =
           &PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
            transform(&in_RDI->
                       super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                     )->super_PredictionSchemeWrapTransformBase<int>;
      std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffffa0);
      PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
                (in_RDX,(int *)CONCAT44(in_ECX,in_R8D),(int *)in_R9,in_stack_ffffffffffffffc8);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputeOriginalValues(const CorrType *in_corr, DataTypeT *out_data,
                          int /* size */, int num_components,
                          const PointIndex *entry_to_point_id_map) {
  if (num_components != 2) {
    // Corrupt/malformed input. Two output components are req'd.
    return false;
  }
  num_components_ = num_components;
  entry_to_point_id_map_ = entry_to_point_id_map;
  predicted_value_ =
      std::unique_ptr<DataTypeT[]>(new DataTypeT[num_components]);
  this->transform().Init(num_components);

  const int corner_map_size =
      static_cast<int>(this->mesh_data().data_to_corner_map()->size());
  for (int p = 0; p < corner_map_size; ++p) {
    const CornerIndex corner_id = this->mesh_data().data_to_corner_map()->at(p);
    if (!ComputePredictedValue(corner_id, out_data, p)) {
      return false;
    }

    const int dst_offset = p * num_components;
    this->transform().ComputeOriginalValue(
        predicted_value_.get(), in_corr + dst_offset, out_data + dst_offset);
  }
  return true;
}